

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O1

deBool Buffer_append(Buffer *buffer,deUint8 *data,size_t numBytes)

{
  size_t sVar1;
  deBool dVar2;
  
  sVar1 = buffer->size;
  dVar2 = Buffer_resize(buffer,sVar1 + numBytes);
  if (dVar2 != 0) {
    memcpy(buffer->data + sVar1,data,numBytes);
  }
  return (uint)(dVar2 != 0);
}

Assistant:

deBool Buffer_append (Buffer* buffer, const deUint8* data, size_t numBytes)
{
	size_t offset = buffer->size;

	if (!Buffer_resize(buffer, buffer->size + numBytes))
		return DE_FALSE;

	/* Append bytes. */
	memcpy(&buffer->data[offset], data, numBytes);
	return DE_TRUE;
}